

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O1

ExpressionPtr * __thiscall VMState::AtStack(VMState *this,int64_t pos)

{
  pointer pSVar1;
  Error *this_00;
  ulong uVar2;
  
  if ((-1 < pos) &&
     (pSVar1 = (this->m_Stack).
               super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>.
               _M_impl.super__Vector_impl_data._M_start,
     uVar2 = ((long)(this->m_Stack).
                    super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
             -0x3333333333333333, (ulong)pos <= uVar2 && uVar2 - pos != 0)) {
    return &pSVar1[pos].expression;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_00,"Accessing non valid stack position.");
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

ExpressionPtr& AtStack( int64_t pos )
	{
		if (pos < 0 || pos >= m_Stack.size())
			throw Error("Accessing non valid stack position.");

		return m_Stack[(size_t) pos].expression;
	}